

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame
          (SimpleLeggedOdometry *this,FrameIndex newFixedFrame)

{
  long in_RDI;
  Transform world_H_newFixed;
  Transform oldFixed_H_newFixed;
  LinkIndex oldFixedLink;
  Transform world_H_oldFixed;
  LinkIndex newFixedLink;
  Transform local_1a8 [96];
  Transform local_148 [96];
  Transform local_e8 [96];
  long local_88;
  Transform local_80 [96];
  long local_20;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x191) & 1) == 0) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","changeFixedFrame",
               "changeFixedFrame was called, but the kinematics info was never setted.");
    local_1 = false;
  }
  else {
    local_20 = iDynTree::Model::getFrameLink(in_RDI);
    if (local_20 == LINK_INVALID_INDEX) {
      iDynTree::reportError
                ("SimpleLeggedOdometry","changeFixedFrame",
                 "changeFixedFrame was called, but the provided new fixed frame is unknown.");
      local_1 = false;
    }
    else {
      iDynTree::Transform::Transform(local_80,(Transform *)(in_RDI + 0x1b8));
      local_88 = *(long *)(in_RDI + 0x198);
      iDynTree::LinkPositions::operator()((LinkPositions *)(in_RDI + 0x1a0),local_88);
      iDynTree::Transform::inverse();
      iDynTree::LinkPositions::operator()((LinkPositions *)(in_RDI + 0x1a0),local_20);
      iDynTree::Transform::operator*(local_e8,local_148);
      iDynTree::Transform::operator*(local_1a8,local_80);
      iDynTree::Transform::operator=((Transform *)(in_RDI + 0x1b8),local_1a8);
      *(long *)(in_RDI + 0x198) = local_20;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const FrameIndex newFixedFrame)
{
    if( !this->m_kinematicsUpdated )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the kinematics info was never setted.");
        return false;
    }

    LinkIndex newFixedLink = this->m_model.getFrameLink(newFixedFrame);

    if( newFixedLink == LINK_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    Transform world_H_oldFixed = this->m_world_H_fixedLink;
    LinkIndex oldFixedLink = m_fixedLinkIndex;
    Transform oldFixed_H_newFixed = m_base_H_link(oldFixedLink).inverse()*m_base_H_link(newFixedLink);
    Transform world_H_newFixed = world_H_oldFixed*oldFixed_H_newFixed;
    this->m_world_H_fixedLink = world_H_newFixed;
    this->m_fixedLinkIndex = newFixedLink;

    return true;
}